

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_addx(DisasContext_conflict2 *s,TCGv_i32 src,TCGv_i32 dest,int opsize)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ah;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  gen_flush_flags(s);
  ah = tcg_const_i32_m68k(tcg_ctx,0);
  tcg_gen_add2_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_X,QREG_CC_X,ah,dest,ah);
  tcg_gen_add2_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_X,QREG_CC_N,QREG_CC_X,src,ah);
  gen_ext(tcg_ctx,QREG_CC_N,QREG_CC_N,opsize,1);
  tcg_gen_xor_i32(tcg_ctx,QREG_CC_V,QREG_CC_N,src);
  tcg_gen_xor_i32(tcg_ctx,ah,dest,src);
  tcg_gen_andc_i32_m68k(tcg_ctx,QREG_CC_V,QREG_CC_V,ah);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ah + (long)tcg_ctx));
  tcg_gen_or_i32(tcg_ctx,QREG_CC_Z,QREG_CC_Z,QREG_CC_N);
  tcg_gen_mov_i32(tcg_ctx,QREG_CC_C,QREG_CC_X);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static inline void gen_addx(DisasContext *s, TCGv src, TCGv dest, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;

    gen_flush_flags(s); /* compute old Z */

    /*
     * Perform addition with carry.
     * (X, N) = src + dest + X;
     */

    tmp = tcg_const_i32(tcg_ctx, 0);
    tcg_gen_add2_i32(tcg_ctx, QREG_CC_N, QREG_CC_X, QREG_CC_X, tmp, dest, tmp);
    tcg_gen_add2_i32(tcg_ctx, QREG_CC_N, QREG_CC_X, QREG_CC_N, QREG_CC_X, src, tmp);
    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, opsize, 1);

    /* Compute signed-overflow for addition.  */

    tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_N, src);
    tcg_gen_xor_i32(tcg_ctx, tmp, dest, src);
    tcg_gen_andc_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, tmp);
    tcg_temp_free(tcg_ctx, tmp);

    /* Copy the rest of the results into place.  */
    tcg_gen_or_i32(tcg_ctx, QREG_CC_Z, QREG_CC_Z, QREG_CC_N); /* !Z is sticky */
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);

    set_cc_op(s, CC_OP_FLAGS);

    /* result is in QREG_CC_N */
}